

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O2

int mbedtls_ecp_self_test(int verbose)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  uint uVar4;
  bool bVar5;
  long local_1e0;
  mbedtls_mpi m;
  mbedtls_ecp_point R;
  mbedtls_ecp_point P;
  mbedtls_ecp_group grp;
  
  memset(&grp,0,0xf8);
  mbedtls_ecp_point_init(&R);
  mbedtls_ecp_point_init(&P);
  mbedtls_mpi_init(&m);
  uVar4 = mbedtls_ecp_group_load(&grp,MBEDTLS_ECP_DP_SECP192R1);
  if (uVar4 == 0) {
    if (verbose != 0) {
      printf("  ECP test #1 (constant op_count, base point G): ");
    }
    uVar4 = mbedtls_mpi_lset(&m,2);
    if (uVar4 == 0) {
      uVar4 = mbedtls_ecp_mul(&grp,&P,&m,&grp.G,(_func_int_void_ptr_uchar_ptr_size_t *)0x0,
                              (void *)0x0);
      if (uVar4 == 0) {
        add_count = 0;
        dbl_count = 0;
        mul_count = 0;
        uVar4 = mbedtls_mpi_read_string(&m,0x10,"000000000000000000000000000000000000000000000001");
        if (uVar4 == 0) {
          uVar4 = mbedtls_ecp_mul(&grp,&R,&m,&grp.G,(_func_int_void_ptr_uchar_ptr_size_t *)0x0,
                                  (void *)0x0);
          if (uVar4 == 0) {
            for (local_1e0 = 1; uVar3 = mul_count, uVar2 = dbl_count, uVar1 = add_count,
                local_1e0 != 6; local_1e0 = local_1e0 + 1) {
              add_count = 0;
              dbl_count = 0;
              mul_count = 0;
              uVar4 = mbedtls_mpi_read_string
                                (&m,0x10,(&PTR_anon_var_dwarf_1df5f_00160c80)[local_1e0]);
              if (uVar4 != 0) goto LAB_001279c0;
              uVar4 = mbedtls_ecp_mul(&grp,&R,&m,&grp.G,(_func_int_void_ptr_uchar_ptr_size_t *)0x0,
                                      (void *)0x0);
              if (uVar4 != 0) goto LAB_001279c0;
              if (((add_count != uVar1) || (dbl_count != uVar2)) || (mul_count != uVar3))
              goto LAB_00127c2c;
            }
            if (verbose != 0) {
              puts("passed");
              printf("  ECP test #2 (constant op_count, other point): ");
            }
            add_count = 0;
            dbl_count = 0;
            mul_count = 0;
            uVar4 = mbedtls_mpi_read_string
                              (&m,0x10,"000000000000000000000000000000000000000000000001");
            if (uVar4 == 0) {
              uVar4 = mbedtls_ecp_mul(&grp,&R,&m,&P,(_func_int_void_ptr_uchar_ptr_size_t *)0x0,
                                      (void *)0x0);
              if (uVar4 == 0) {
                for (local_1e0 = 1; uVar3 = mul_count, uVar2 = dbl_count, uVar1 = add_count,
                    local_1e0 != 6; local_1e0 = local_1e0 + 1) {
                  add_count = 0;
                  dbl_count = 0;
                  mul_count = 0;
                  uVar4 = mbedtls_mpi_read_string
                                    (&m,0x10,(&PTR_anon_var_dwarf_1df5f_00160c80)[local_1e0]);
                  if (uVar4 != 0) goto LAB_001279c0;
                  uVar4 = mbedtls_ecp_mul(&grp,&R,&m,&P,(_func_int_void_ptr_uchar_ptr_size_t *)0x0,
                                          (void *)0x0);
                  if (uVar4 != 0) goto LAB_001279c0;
                  if (((add_count != uVar1) || (dbl_count != uVar2)) || (mul_count != uVar3))
                  goto LAB_00127c2c;
                }
                uVar4 = 0;
                if (verbose != 0) {
                  puts("passed");
                  uVar4 = 0;
                }
                goto LAB_00127c43;
              }
            }
          }
        }
      }
    }
  }
LAB_001279c0:
  bVar5 = verbose != 0;
  if ((bVar5) && ((int)uVar4 < 0)) {
    printf("Unexpected error, return code = %08X\n",(ulong)uVar4);
    bVar5 = true;
  }
  goto LAB_001279e1;
LAB_00127c2c:
  uVar4 = 1;
  if (verbose != 0) {
    printf("failed (%u)\n",local_1e0);
  }
LAB_00127c43:
  bVar5 = verbose != 0;
LAB_001279e1:
  mbedtls_ecp_group_free(&grp);
  mbedtls_ecp_point_free(&R);
  mbedtls_ecp_point_free(&P);
  mbedtls_mpi_free(&m);
  if (bVar5) {
    putchar(10);
  }
  return uVar4;
}

Assistant:

int mbedtls_ecp_self_test( int verbose )
{
    int ret;
    size_t i;
    mbedtls_ecp_group grp;
    mbedtls_ecp_point R, P;
    mbedtls_mpi m;
    unsigned long add_c_prev, dbl_c_prev, mul_c_prev;
    /* exponents especially adapted for secp192r1 */
    const char *exponents[] =
    {
        "000000000000000000000000000000000000000000000001", /* one */
        "FFFFFFFFFFFFFFFFFFFFFFFF99DEF836146BC9B1B4D22830", /* N - 1 */
        "5EA6F389A38B8BC81E767753B15AA5569E1782E30ABE7D25", /* random */
        "400000000000000000000000000000000000000000000000", /* one and zeros */
        "7FFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFF", /* all ones */
        "555555555555555555555555555555555555555555555555", /* 101010... */
    };

    mbedtls_ecp_group_init( &grp );
    mbedtls_ecp_point_init( &R );
    mbedtls_ecp_point_init( &P );
    mbedtls_mpi_init( &m );

    /* Use secp192r1 if available, or any available curve */
#if defined(MBEDTLS_ECP_DP_SECP192R1_ENABLED)
    MBEDTLS_MPI_CHK( mbedtls_ecp_group_load( &grp, MBEDTLS_ECP_DP_SECP192R1 ) );
#else
    MBEDTLS_MPI_CHK( mbedtls_ecp_group_load( &grp, mbedtls_ecp_curve_list()->grp_id ) );
#endif

    if( verbose != 0 )
        mbedtls_printf( "  ECP test #1 (constant op_count, base point G): " );

    /* Do a dummy multiplication first to trigger precomputation */
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &m, 2 ) );
    MBEDTLS_MPI_CHK( mbedtls_ecp_mul( &grp, &P, &m, &grp.G, NULL, NULL ) );

    add_count = 0;
    dbl_count = 0;
    mul_count = 0;
    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &m, 16, exponents[0] ) );
    MBEDTLS_MPI_CHK( mbedtls_ecp_mul( &grp, &R, &m, &grp.G, NULL, NULL ) );

    for( i = 1; i < sizeof( exponents ) / sizeof( exponents[0] ); i++ )
    {
        add_c_prev = add_count;
        dbl_c_prev = dbl_count;
        mul_c_prev = mul_count;
        add_count = 0;
        dbl_count = 0;
        mul_count = 0;

        MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &m, 16, exponents[i] ) );
        MBEDTLS_MPI_CHK( mbedtls_ecp_mul( &grp, &R, &m, &grp.G, NULL, NULL ) );

        if( add_count != add_c_prev ||
            dbl_count != dbl_c_prev ||
            mul_count != mul_c_prev )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed (%u)\n", (unsigned int) i );

            ret = 1;
            goto cleanup;
        }
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

    if( verbose != 0 )
        mbedtls_printf( "  ECP test #2 (constant op_count, other point): " );
    /* We computed P = 2G last time, use it */

    add_count = 0;
    dbl_count = 0;
    mul_count = 0;
    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &m, 16, exponents[0] ) );
    MBEDTLS_MPI_CHK( mbedtls_ecp_mul( &grp, &R, &m, &P, NULL, NULL ) );

    for( i = 1; i < sizeof( exponents ) / sizeof( exponents[0] ); i++ )
    {
        add_c_prev = add_count;
        dbl_c_prev = dbl_count;
        mul_c_prev = mul_count;
        add_count = 0;
        dbl_count = 0;
        mul_count = 0;

        MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &m, 16, exponents[i] ) );
        MBEDTLS_MPI_CHK( mbedtls_ecp_mul( &grp, &R, &m, &P, NULL, NULL ) );

        if( add_count != add_c_prev ||
            dbl_count != dbl_c_prev ||
            mul_count != mul_c_prev )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed (%u)\n", (unsigned int) i );

            ret = 1;
            goto cleanup;
        }
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

cleanup:

    if( ret < 0 && verbose != 0 )
        mbedtls_printf( "Unexpected error, return code = %08X\n", ret );

    mbedtls_ecp_group_free( &grp );
    mbedtls_ecp_point_free( &R );
    mbedtls_ecp_point_free( &P );
    mbedtls_mpi_free( &m );

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    return( ret );
}